

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

bool __thiscall wabt::WastLexer::ReadBlockComment(WastLexer *this,WastParser *parser)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  pcVar3 = this->buffer_end_;
  iVar4 = this->line_;
  iVar5 = 1;
  pcVar1 = this->cursor_;
  do {
    do {
      while( true ) {
        while( true ) {
          pcVar6 = pcVar1;
          if (pcVar3 <= pcVar6) {
            GetLocation(this);
            WastParser::Error(parser,0x28a988);
            goto LAB_0022e43d;
          }
          pcVar1 = pcVar6 + 1;
          this->cursor_ = pcVar1;
          cVar2 = *pcVar6;
          if (cVar2 != '\n') break;
          iVar4 = iVar4 + 1;
          this->line_ = iVar4;
          this->line_start_ = pcVar1;
        }
        if (cVar2 != '(') break;
        if ((pcVar1 < pcVar3) && (*pcVar1 == ';')) {
          this->cursor_ = pcVar6 + 2;
          iVar5 = iVar5 + 1;
          pcVar1 = pcVar6 + 2;
        }
      }
    } while (((cVar2 != ';') || (pcVar3 <= pcVar1)) || (*pcVar1 != ')'));
    this->cursor_ = pcVar6 + 2;
    iVar5 = iVar5 + -1;
    pcVar1 = pcVar6 + 2;
  } while (iVar5 != 0);
LAB_0022e43d:
  return pcVar6 < pcVar3;
}

Assistant:

bool WastLexer::ReadBlockComment(WastParser* parser) {
  int nesting = 1;
  while (true) {
    switch (ReadChar()) {
      case kEof:
        ERROR("EOF in block comment");
        return false;

      case ';':
        if (MatchChar(')') && --nesting == 0) {
          return true;
        }
        break;

      case '(':
        if (MatchChar(';')) {
          nesting++;
        }
        break;

      case '\n':
        Newline();
        break;
    }
  }
}